

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

saucy * saucy_alloc(Abc_Ntk_t *pNtk)

{
  size_t __nmemb;
  size_t __size;
  size_t __size_00;
  int iVar1;
  saucy *s;
  int *piVar2;
  char *pcVar3;
  void *pvVar4;
  Vec_Int_t **ppVVar5;
  Vec_Int_t *pVVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  
  iVar9 = pNtk->vPos->nSize;
  lVar10 = (long)iVar9;
  iVar1 = pNtk->vPis->nSize;
  lVar12 = (long)iVar1;
  s = (saucy *)malloc(0x2b8);
  if (s != (saucy *)0x0) {
    __nmemb = lVar12 + lVar10;
    __size_00 = __nmemb * 4;
    piVar2 = (int *)malloc(__size_00);
    s->ninduce = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->sinduce = piVar2;
    pcVar3 = (char *)calloc(__nmemb,1);
    s->indmark = pcVar3;
    piVar2 = (int *)calloc(__nmemb,4);
    (s->left).cfront = piVar2;
    piVar2 = (int *)malloc(__size_00);
    (s->left).clen = piVar2;
    piVar2 = (int *)calloc(__nmemb,4);
    (s->right).cfront = piVar2;
    piVar2 = (int *)malloc(__size_00);
    (s->right).clen = piVar2;
    iVar11 = (int)__nmemb;
    lVar13 = (long)iVar11;
    pcVar3 = (char *)calloc(lVar13 + 1,1);
    s->stuff = pcVar3;
    piVar2 = (int *)malloc(lVar13 * 4 + 8);
    s->bucket = piVar2;
    __size = lVar13 * 4 + 4;
    piVar2 = (int *)malloc(__size);
    s->count = piVar2;
    piVar2 = (int *)calloc(__nmemb,4);
    s->ccount = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->clist = piVar2;
    pvVar4 = malloc(__size);
    s->nextnon = (int *)((long)pvVar4 + 4);
    piVar2 = (int *)malloc(__size);
    s->prevnon = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->anctar = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->start = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->gamma = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->junk = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->theta = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->thsize = piVar2;
    piVar2 = (int *)malloc(__size_00);
    (s->left).lab = piVar2;
    piVar2 = (int *)malloc(__size_00);
    (s->left).unlab = piVar2;
    piVar2 = (int *)malloc(__size_00);
    (s->right).lab = piVar2;
    piVar2 = (int *)malloc(__size_00);
    (s->right).unlab = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->splitvar = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->splitwho = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->splitfrom = piVar2;
    piVar2 = (int *)malloc(__size);
    s->splitlev = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->unsupp = piVar2;
    piVar2 = (int *)calloc(__nmemb,4);
    s->conncnts = piVar2;
    pcVar3 = (char *)calloc(__nmemb,1);
    s->diffmark = pcVar3;
    piVar2 = (int *)malloc(__size_00);
    s->diffs = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->difflev = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->undifflev = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->specmin = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->thnext = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->thprev = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->threp = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->thfront = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->pairs = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->unpairs = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->diffnons = piVar2;
    piVar2 = (int *)malloc(__size_00);
    s->undiffnons = piVar2;
    pcVar3 = (char *)calloc(__nmemb,1);
    s->marks = pcVar3;
    ppVVar5 = (Vec_Int_t **)malloc(lVar12 * 8);
    s->iDep = ppVVar5;
    ppVVar5 = (Vec_Int_t **)malloc(lVar10 * 8);
    s->oDep = ppVVar5;
    ppVVar5 = (Vec_Int_t **)malloc(lVar12 * 8);
    s->obs = ppVVar5;
    ppVVar5 = (Vec_Int_t **)malloc(lVar10 * 8);
    s->ctrl = ppVVar5;
    if (0 < iVar1) {
      lVar13 = 0;
      do {
        pVVar6 = (Vec_Int_t *)malloc(0x10);
        pVVar6->nCap = 0x10;
        pVVar6->nSize = 0;
        piVar2 = (int *)malloc(0x40);
        pVVar6->pArray = piVar2;
        s->iDep[lVar13] = pVVar6;
        pVVar6 = (Vec_Int_t *)malloc(0x10);
        pVVar6->nCap = 0x10;
        pVVar6->nSize = 0;
        piVar2 = (int *)malloc(0x40);
        pVVar6->pArray = piVar2;
        s->obs[lVar13] = pVVar6;
        lVar13 = lVar13 + 1;
      } while (lVar12 != lVar13);
    }
    if (0 < iVar9) {
      lVar13 = 0;
      do {
        pVVar6 = (Vec_Int_t *)malloc(0x10);
        pVVar6->nCap = 0x10;
        pVVar6->nSize = 0;
        piVar2 = (int *)malloc(0x40);
        pVVar6->pArray = piVar2;
        s->oDep[lVar13] = pVVar6;
        pVVar6 = (Vec_Int_t *)malloc(0x10);
        pVVar6->nCap = 0x10;
        pVVar6->nSize = 0;
        piVar2 = (int *)malloc(0x40);
        pVVar6->pArray = piVar2;
        s->ctrl[lVar13] = pVVar6;
        lVar13 = lVar13 + 1;
      } while (lVar10 != lVar13);
    }
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    iVar9 = 8;
    if (6 < iVar11 - 1U) {
      iVar9 = iVar11;
    }
    pVVar7->nSize = 0;
    pVVar7->nCap = iVar9;
    if (iVar9 == 0) {
      ppvVar8 = (void **)0x0;
    }
    else {
      ppvVar8 = (void **)malloc((long)iVar9 * 8);
    }
    pVVar7->pArray = ppvVar8;
    s->randomVectorArray_sim1 = pVVar7;
    piVar2 = (int *)calloc(__nmemb,4);
    s->randomVectorSplit_sim1 = piVar2;
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    pVVar7->nSize = 0;
    pVVar7->nCap = iVar9;
    if (iVar9 == 0) {
      ppvVar8 = (void **)0x0;
    }
    else {
      ppvVar8 = (void **)malloc((long)iVar9 << 3);
    }
    pVVar7->pArray = ppvVar8;
    s->randomVectorArray_sim2 = pVVar7;
    piVar2 = (int *)calloc(__nmemb,4);
    s->randomVectorSplit_sim2 = piVar2;
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    pVVar7->nCap = 8;
    pVVar7->nSize = 0;
    ppvVar8 = (void **)malloc(0x40);
    pVVar7->pArray = ppvVar8;
    s->satCounterExamples = pVVar7;
    piVar2 = (int *)malloc(lVar12 << 2);
    s->pModel = piVar2;
    if ((((((s->ninduce != (int *)0x0) && (s->sinduce != (int *)0x0)) &&
          ((s->left).cfront != (int *)0x0)) &&
         ((((((s->left).clen != (int *)0x0 && ((s->right).cfront != (int *)0x0)) &&
            (((s->right).clen != (int *)0x0 &&
             ((s->stuff != (char *)0x0 && (s->bucket != (int *)0x0)))))) && (s->count != (int *)0x0)
           ) && ((((s->ccount != (int *)0x0 && (s->clist != (int *)0x0)) &&
                  (s->prevnon != (int *)0x0)) &&
                 ((s->start != (int *)0x0 && (s->gamma != (int *)0x0)))))))) &&
        ((((s->theta != (int *)0x0 &&
           (((s->left).unlab != (int *)0x0 && ((s->right).lab != (int *)0x0)))) &&
          (((s->right).unlab != (int *)0x0 &&
           (((((s->left).lab != (int *)0x0 && (s->splitvar != (int *)0x0)) &&
             (s->splitwho != (int *)0x0)) &&
            ((s->junk != (int *)0x0 && (s->splitfrom != (int *)0x0)))))))) &&
         ((s->splitlev != (int *)0x0 && ((s->thsize != (int *)0x0 && (s->unsupp != (int *)0x0)))))))
        ) && (((s->conncnts != (int *)0x0 &&
               (((s->anctar != (int *)0x0 && (s->diffmark != (char *)0x0)) &&
                (s->diffs != (int *)0x0)))) &&
              ((((s->indmark != (char *)0x0 && (s->thnext != (int *)0x0)) &&
                ((s->thprev != (int *)0x0 &&
                 ((s->threp != (int *)0x0 && (s->thfront != (int *)0x0)))))) &&
               ((s->pairs != (int *)0x0 &&
                (((((s->unpairs != (int *)0x0 && (s->diffnons != (int *)0x0)) &&
                   (s->undiffnons != (int *)0x0)) &&
                  ((s->difflev != (int *)0x0 && (s->undifflev != (int *)0x0)))) &&
                 (s->specmin != (int *)0x0)))))))))) {
      return s;
    }
    saucy_free(s);
  }
  return (saucy *)0x0;
}

Assistant:

struct saucy *
saucy_alloc(Abc_Ntk_t * pNtk)
{
    int i;
    int numouts = Abc_NtkPoNum(pNtk);
    int numins =  Abc_NtkPiNum(pNtk);
    int n = numins + numouts;
    struct saucy *s = ABC_ALLOC(struct saucy, 1);
    if (s == NULL) return NULL;

    s->ninduce = ints(n);
    s->sinduce = ints(n);
    s->indmark = bits(n);
    s->left.cfront = zeros(n);
    s->left.clen = ints(n);
    s->right.cfront = zeros(n);
    s->right.clen = ints(n);
    s->stuff = bits(n+1);
    s->bucket = ints(n+2);
    s->count = ints(n+1);
    s->ccount = zeros(n);
    s->clist = ints(n);
    s->nextnon = ints(n+1) + 1;
    s->prevnon = ints(n+1);
    s->anctar = ints(n);
    s->start = ints(n);
    s->gamma = ints(n);
    s->junk = ints(n);
    s->theta = ints(n);
    s->thsize = ints(n);
    s->left.lab = ints(n);
    s->left.unlab = ints(n);
    s->right.lab = ints(n);
    s->right.unlab = ints(n);
    s->splitvar = ints(n);
    s->splitwho = ints(n);
    s->splitfrom = ints(n);
    s->splitlev = ints(n+1);
    s->unsupp = ints(n);
    s->conncnts = zeros(n);
    s->diffmark = bits(n);
    s->diffs = ints(n);
    s->difflev = ints(n);
    s->undifflev = ints(n);
    s->specmin = ints(n);
    s->thnext = ints(n);
    s->thprev = ints(n);
    s->threp = ints(n);
    s->thfront = ints(n);
    s->pairs = ints(n);
    s->unpairs = ints(n);
    s->diffnons = ints(n);
    s->undiffnons = ints(n);
    s->marks = bits(n);

    s->iDep = ABC_ALLOC( Vec_Int_t*,  numins );
    s->oDep = ABC_ALLOC( Vec_Int_t*,  numouts );
    s->obs  = ABC_ALLOC( Vec_Int_t*,  numins );
    s->ctrl = ABC_ALLOC( Vec_Int_t*,  numouts );

    for(i = 0; i < numins; i++) {       
        s->iDep[i] = Vec_IntAlloc( 1 );
        s->obs[i] = Vec_IntAlloc( 1 );
    }
    for(i = 0; i < numouts; i++) {      
        s->oDep[i] = Vec_IntAlloc( 1 );
        s->ctrl[i] = Vec_IntAlloc( 1 );
    }   

    s->randomVectorArray_sim1 = Vec_PtrAlloc( n );  
    s->randomVectorSplit_sim1 = zeros( n );
    s->randomVectorArray_sim2 = Vec_PtrAlloc( n );  
    s->randomVectorSplit_sim2= zeros( n );

    s->satCounterExamples = Vec_PtrAlloc( 1 );
    s->pModel = ints( numins );

    if (s->ninduce && s->sinduce && s->left.cfront && s->left.clen
        && s->right.cfront && s->right.clen
        && s->stuff && s->bucket && s->count && s->ccount
        && s->clist && s->nextnon-1 && s->prevnon
        && s->start && s->gamma && s->theta && s->left.unlab
        && s->right.lab && s->right.unlab
        && s->left.lab &&  s->splitvar && s->splitwho && s->junk
        && s->splitfrom && s->splitlev && s->thsize
        && s->unsupp && s->conncnts && s->anctar
        && s->diffmark && s->diffs && s->indmark
        && s->thnext && s->thprev && s->threp && s->thfront
        && s->pairs && s->unpairs && s->diffnons && s->undiffnons
        && s->difflev && s->undifflev && s->specmin)
    {
        return s;
    }
    else {
        saucy_free(s);
        return NULL;
    }
}